

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

bool __thiscall GEO::FileSystem::MemoryNode::is_directory(MemoryNode *this,string *path)

{
  int iVar1;
  iterator iVar2;
  MemoryNode *pMVar3;
  undefined1 uVar4;
  string rest;
  string subdir;
  string result;
  string local_80;
  string local_60;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  local_38 = 0;
  local_30[0] = 0;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_40 = local_30;
  split_path(path,&local_60,&local_80);
  iVar1 = std::__cxx11::string::compare((char *)&local_60);
  if (iVar1 == 0) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>_>
            ::find(&(this->subnodes_)._M_t,&local_80);
    uVar4 = (_Rb_tree_header *)iVar2._M_node !=
            &(this->subnodes_)._M_t._M_impl.super__Rb_tree_header;
  }
  else {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>_>
            ::find(&(this->subnodes_)._M_t,&local_60);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->subnodes_)._M_t._M_impl.super__Rb_tree_header) {
      uVar4 = 0;
    }
    else {
      pMVar3 = SmartPointer<GEO::FileSystem::MemoryNode>::operator->
                         ((SmartPointer<GEO::FileSystem::MemoryNode> *)(iVar2._M_node + 2));
      iVar1 = (*(pMVar3->super_Node).super_Counted._vptr_Counted[3])(pMVar3,&local_80);
      uVar4 = (undefined1)iVar1;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return (bool)uVar4;
}

Assistant:

bool MemoryNode::is_directory(const std::string& path) {
	    std::string result;
	    std::string subdir;
	    std::string rest;
	    split_path(path, subdir, rest);
	    if(subdir == "") {
		return(subnodes_.find(rest) != subnodes_.end());
	    } else {
		auto it = subnodes_.find(subdir);
		if(it == subnodes_.end()) {
		    return false;
		}
		return it->second->is_directory(rest);
	    }
	}